

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_names.cc
# Opt level: O1

bool __thiscall
bssl::ParseGeneralName
          (bssl *this,Input input,ParseGeneralNameIPAddressType ip_address_type,
          GeneralNames *subtrees,CertErrors *errors)

{
  iterator iVar1;
  iterator iVar2;
  Input input_00;
  bool bVar3;
  uint uVar4;
  undefined4 in_register_0000000c;
  vector<bssl::der::Input,std::allocator<bssl::der::Input>> *this_00;
  Input mask_00;
  Input input_01;
  string_view str;
  string_view str_00;
  string_view str_01;
  Input value;
  string_view s;
  CBS_ASN1_TAG tag;
  Input mask;
  Parser parser;
  Input local_88;
  Parser local_70;
  long *local_58;
  uint local_4c;
  Input local_48;
  Parser local_38;
  
  this_00 = (vector<bssl::der::Input,std::allocator<bssl::der::Input>> *)
            CONCAT44(in_register_0000000c,ip_address_type);
  if (subtrees == (GeneralNames *)0x0) {
LAB_004ade11:
    abort();
  }
  input_01.data_.size_ = (size_t)input.data_.data_;
  input_01.data_.data_ = (uchar *)this;
  der::Parser::Parser(&local_38,input_01);
  local_88.data_.data_ = (uchar *)0x0;
  local_88.data_.size_ = 0;
  bVar3 = der::Parser::ReadTagAndValue(&local_38,&local_4c,&local_88);
  if (!bVar3) {
    return false;
  }
  switch(local_4c) {
  case 0x80000001:
    local_70.cbs_.data = (uint8_t *)local_88.data_.size_;
    local_70.cbs_.len = (size_t)local_88.data_.data_;
    str._M_str._0_4_ = local_4c;
    str._M_len = (size_t)local_88.data_.data_;
    str._M_str._4_4_ = 0;
    bVar3 = string_util::IsAscii((string_util *)local_88.data_.size_,str);
    if (bVar3) {
      iVar1._M_current = *(basic_string_view<char,_std::char_traits<char>_> **)(this_00 + 0x20);
      if (iVar1._M_current == *(basic_string_view<char,_std::char_traits<char>_> **)(this_00 + 0x28)
         ) {
        ::std::
        vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>const&>
                  ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    *)(this_00 + 0x18),iVar1,
                   (basic_string_view<char,_std::char_traits<char>_> *)&local_70);
      }
      else {
        (iVar1._M_current)->_M_len = (size_t)local_70.cbs_.data;
        (iVar1._M_current)->_M_str = (char *)local_70.cbs_.len;
        *(long *)(this_00 + 0x20) = *(long *)(this_00 + 0x20) + 0x10;
      }
    }
    else {
      CertErrors::AddError((CertErrors *)subtrees,"rfc822Name is not ASCII");
    }
    uVar4 = 2;
    break;
  case 0x80000002:
    local_70.cbs_.data = (uint8_t *)local_88.data_.size_;
    local_70.cbs_.len = (size_t)local_88.data_.data_;
    str_01._M_str._0_4_ = local_4c;
    str_01._M_len = (size_t)local_88.data_.data_;
    str_01._M_str._4_4_ = 0;
    bVar3 = string_util::IsAscii((string_util *)local_88.data_.size_,str_01);
    if (bVar3) {
      iVar1._M_current = *(basic_string_view<char,_std::char_traits<char>_> **)(this_00 + 0x38);
      if (iVar1._M_current == *(basic_string_view<char,_std::char_traits<char>_> **)(this_00 + 0x40)
         ) {
        ::std::
        vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>const&>
                  ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    *)(this_00 + 0x30),iVar1,
                   (basic_string_view<char,_std::char_traits<char>_> *)&local_70);
      }
      else {
        (iVar1._M_current)->_M_len = (size_t)local_70.cbs_.data;
        (iVar1._M_current)->_M_str = (char *)local_70.cbs_.len;
        *(long *)(this_00 + 0x38) = *(long *)(this_00 + 0x38) + 0x10;
      }
    }
    else {
      CertErrors::AddError((CertErrors *)subtrees,"dNSName is not ASCII");
    }
    uVar4 = 4;
    break;
  case 0x80000003:
  case 0x80000004:
  case 0x80000005:
switchD_004ad9f8_caseD_80000003:
    CreateCertErrorParams1SizeT((bssl *)&local_58,"tag",(ulong)local_4c);
    CertErrors::AddError
              ((CertErrors *)subtrees,"Unknown GeneralName type",
               (unique_ptr<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>_> *)
               &local_58);
    if (local_58 == (long *)0x0) {
      return false;
    }
    (**(code **)(*local_58 + 8))();
    return false;
  case 0x80000006:
    local_70.cbs_.data = (uint8_t *)local_88.data_.size_;
    local_70.cbs_.len = (size_t)local_88.data_.data_;
    str_00._M_str._0_4_ = local_4c;
    str_00._M_len = (size_t)local_88.data_.data_;
    str_00._M_str._4_4_ = 0;
    bVar3 = string_util::IsAscii((string_util *)local_88.data_.size_,str_00);
    if (bVar3) {
      iVar1._M_current = *(basic_string_view<char,_std::char_traits<char>_> **)(this_00 + 0x98);
      if (iVar1._M_current == *(basic_string_view<char,_std::char_traits<char>_> **)(this_00 + 0xa0)
         ) {
        ::std::
        vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>const&>
                  ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    *)(this_00 + 0x90),iVar1,
                   (basic_string_view<char,_std::char_traits<char>_> *)&local_70);
      }
      else {
        (iVar1._M_current)->_M_len = (size_t)local_70.cbs_.data;
        (iVar1._M_current)->_M_str = (char *)local_70.cbs_.len;
        *(long *)(this_00 + 0x98) = *(long *)(this_00 + 0x98) + 0x10;
      }
    }
    else {
      CertErrors::AddError((CertErrors *)subtrees,"uniformResourceIdentifier is not ASCII");
    }
    uVar4 = 0x40;
    break;
  case 0x80000007:
    if ((int)input.data_.size_ != 1) {
      if ((int)input.data_.size_ != 0) goto LAB_004ade11;
      if (((string_util *)local_88.data_.size_ != (string_util *)&DAT_00000004) &&
         ((string_util *)local_88.data_.size_ != (string_util *)0x10)) goto LAB_004add63;
      iVar2._M_current = *(Input **)(this_00 + 0xb0);
      if (iVar2._M_current == *(Input **)(this_00 + 0xb8)) {
        ::std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>::
        _M_realloc_insert<bssl::der::Input_const&>(this_00 + 0xa8,iVar2,&local_88);
      }
      else {
        ((iVar2._M_current)->data_).data_ = local_88.data_.data_;
        ((iVar2._M_current)->data_).size_ = local_88.data_.size_;
        *(long *)(this_00 + 0xb0) = *(long *)(this_00 + 0xb0) + 0x10;
      }
      uVar4 = 0x80;
      goto LAB_004addcf;
    }
    if (((string_util *)local_88.data_.size_ != (string_util *)&DAT_00000008) &&
       ((string_util *)local_88.data_.size_ != (string_util *)0x20)) {
LAB_004add63:
      CertErrors::AddError((CertErrors *)subtrees,"Failed parsing iPAddress");
      return false;
    }
    local_70.cbs_.len = local_88.data_.size_ >> 1;
    local_70.cbs_.data = local_88.data_.data_;
    mask_00.data_.data_ = local_88.data_.data_ + local_70.cbs_.len;
    mask_00.data_.size_ = local_88.data_.size_ - local_70.cbs_.len;
    local_48.data_.data_ = mask_00.data_.data_;
    local_48.data_.size_ = mask_00.data_.size_;
    bVar3 = IsValidNetmask(mask_00);
    if (bVar3) {
      ::std::
      vector<std::pair<bssl::der::Input,bssl::der::Input>,std::allocator<std::pair<bssl::der::Input,bssl::der::Input>>>
      ::emplace_back<bssl::der::Input&,bssl::der::Input&>
                ((vector<std::pair<bssl::der::Input,bssl::der::Input>,std::allocator<std::pair<bssl::der::Input,bssl::der::Input>>>
                  *)(this_00 + 0xc0),(Input *)&local_70,&local_48);
    }
    else {
      CertErrors::AddError((CertErrors *)subtrees,"Failed parsing iPAddress");
    }
    uVar4 = 0x80;
    break;
  case 0x80000008:
    iVar2._M_current = *(Input **)(this_00 + 0xe0);
    if (iVar2._M_current == *(Input **)(this_00 + 0xe8)) {
      ::std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>::
      _M_realloc_insert<bssl::der::Input_const&>(this_00 + 0xd8,iVar2,&local_88);
    }
    else {
      ((iVar2._M_current)->data_).data_ = local_88.data_.data_;
      ((iVar2._M_current)->data_).size_ = local_88.data_.size_;
      *(long *)(this_00 + 0xe0) = *(long *)(this_00 + 0xe0) + 0x10;
    }
    uVar4 = 0x100;
    goto LAB_004addcf;
  default:
    switch(local_4c) {
    case 0xa0000000:
      iVar2._M_current = *(Input **)(this_00 + 8);
      if (iVar2._M_current == *(Input **)(this_00 + 0x10)) {
        ::std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>::
        _M_realloc_insert<bssl::der::Input_const&>(this_00,iVar2,&local_88);
      }
      else {
        ((iVar2._M_current)->data_).data_ = local_88.data_.data_;
        ((iVar2._M_current)->data_).size_ = local_88.data_.size_;
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x10;
      }
      uVar4 = 1;
      break;
    default:
      goto switchD_004ad9f8_caseD_80000003;
    case 0xa0000003:
      iVar2._M_current = *(Input **)(this_00 + 0x50);
      if (iVar2._M_current == *(Input **)(this_00 + 0x58)) {
        ::std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>::
        _M_realloc_insert<bssl::der::Input_const&>(this_00 + 0x48,iVar2,&local_88);
      }
      else {
        ((iVar2._M_current)->data_).data_ = local_88.data_.data_;
        ((iVar2._M_current)->data_).size_ = local_88.data_.size_;
        *(long *)(this_00 + 0x50) = *(long *)(this_00 + 0x50) + 0x10;
      }
      uVar4 = 8;
      break;
    case 0xa0000004:
      input_00.data_.size_ = local_88.data_.size_;
      input_00.data_.data_ = local_88.data_.data_;
      der::Parser::Parser(&local_70,input_00);
      local_48.data_.data_ = (uchar *)0x0;
      local_48.data_.size_ = 0;
      bVar3 = der::Parser::ReadTag(&local_70,0x20000010,&local_48);
      if (!bVar3) {
        return false;
      }
      bVar3 = der::Parser::HasMore(&local_38);
      if (bVar3) {
        return false;
      }
      iVar2._M_current = *(Input **)(this_00 + 0x68);
      if (iVar2._M_current == *(Input **)(this_00 + 0x70)) {
        ::std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>::
        _M_realloc_insert<bssl::der::Input_const&>(this_00 + 0x60,iVar2,&local_48);
      }
      else {
        ((iVar2._M_current)->data_).data_ = local_48.data_.data_;
        ((iVar2._M_current)->data_).size_ = local_48.data_.size_;
        *(long *)(this_00 + 0x68) = *(long *)(this_00 + 0x68) + 0x10;
      }
      uVar4 = 0x10;
      break;
    case 0xa0000005:
      iVar2._M_current = *(Input **)(this_00 + 0x80);
      if (iVar2._M_current == *(Input **)(this_00 + 0x88)) {
        ::std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>::
        _M_realloc_insert<bssl::der::Input_const&>(this_00 + 0x78,iVar2,&local_88);
      }
      else {
        ((iVar2._M_current)->data_).data_ = local_88.data_.data_;
        ((iVar2._M_current)->data_).size_ = local_88.data_.size_;
        *(long *)(this_00 + 0x80) = *(long *)(this_00 + 0x80) + 0x10;
      }
      uVar4 = 0x20;
    }
    goto LAB_004addcf;
  }
  if (bVar3 == false) {
    return false;
  }
LAB_004addcf:
  *(uint *)(this_00 + 0xf0) = *(uint *)(this_00 + 0xf0) | uVar4;
  return true;
}

Assistant:

[[nodiscard]] bool ParseGeneralName(
    der::Input input,
    GeneralNames::ParseGeneralNameIPAddressType ip_address_type,
    GeneralNames *subtrees, CertErrors *errors) {
  BSSL_CHECK(errors);
  der::Parser parser(input);
  CBS_ASN1_TAG tag;
  der::Input value;
  if (!parser.ReadTagAndValue(&tag, &value)) {
    return false;
  }
  GeneralNameTypes name_type = GENERAL_NAME_NONE;
  if (tag == (CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 0)) {
    // otherName                       [0]     OtherName,
    name_type = GENERAL_NAME_OTHER_NAME;
    subtrees->other_names.push_back(value);
  } else if (tag == (CBS_ASN1_CONTEXT_SPECIFIC | 1)) {
    // rfc822Name                      [1]     IA5String,
    name_type = GENERAL_NAME_RFC822_NAME;
    const std::string_view s = BytesAsStringView(value);
    if (!bssl::string_util::IsAscii(s)) {
      errors->AddError(kRFC822NameNotAscii);
      return false;
    }
    subtrees->rfc822_names.push_back(s);
  } else if (tag == (CBS_ASN1_CONTEXT_SPECIFIC | 2)) {
    // dNSName                         [2]     IA5String,
    name_type = GENERAL_NAME_DNS_NAME;
    const std::string_view s = BytesAsStringView(value);
    if (!bssl::string_util::IsAscii(s)) {
      errors->AddError(kDnsNameNotAscii);
      return false;
    }
    subtrees->dns_names.push_back(s);
  } else if (tag == (CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 3)) {
    // x400Address                     [3]     ORAddress,
    name_type = GENERAL_NAME_X400_ADDRESS;
    subtrees->x400_addresses.push_back(value);
  } else if (tag == (CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 4)) {
    // directoryName                   [4]     Name,
    name_type = GENERAL_NAME_DIRECTORY_NAME;
    // Name is a CHOICE { rdnSequence  RDNSequence }, therefore the SEQUENCE
    // tag is explicit. Remove it, since the name matching functions expect
    // only the value portion.
    der::Parser name_parser(value);
    der::Input name_value;
    if (!name_parser.ReadTag(CBS_ASN1_SEQUENCE, &name_value) ||
        parser.HasMore()) {
      return false;
    }
    subtrees->directory_names.push_back(name_value);
  } else if (tag == (CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 5)) {
    // ediPartyName                    [5]     EDIPartyName,
    name_type = GENERAL_NAME_EDI_PARTY_NAME;
    subtrees->edi_party_names.push_back(value);
  } else if (tag == (CBS_ASN1_CONTEXT_SPECIFIC | 6)) {
    // uniformResourceIdentifier       [6]     IA5String,
    name_type = GENERAL_NAME_UNIFORM_RESOURCE_IDENTIFIER;
    const std::string_view s = BytesAsStringView(value);
    if (!bssl::string_util::IsAscii(s)) {
      errors->AddError(kURINotAscii);
      return false;
    }
    subtrees->uniform_resource_identifiers.push_back(s);
  } else if (tag == (CBS_ASN1_CONTEXT_SPECIFIC | 7)) {
    // iPAddress                       [7]     OCTET STRING,
    name_type = GENERAL_NAME_IP_ADDRESS;
    if (ip_address_type == GeneralNames::IP_ADDRESS_ONLY) {
      // RFC 5280 section 4.2.1.6:
      // When the subjectAltName extension contains an iPAddress, the address
      // MUST be stored in the octet string in "network byte order", as
      // specified in [RFC791].  The least significant bit (LSB) of each octet
      // is the LSB of the corresponding byte in the network address.  For IP
      // version 4, as specified in [RFC791], the octet string MUST contain
      // exactly four octets.  For IP version 6, as specified in [RFC2460],
      // the octet string MUST contain exactly sixteen octets.
      if ((value.size() != kIPv4AddressSize &&
           value.size() != kIPv6AddressSize)) {
        errors->AddError(kFailedParsingIp);
        return false;
      }
      subtrees->ip_addresses.push_back(value);
    } else {
      BSSL_CHECK(ip_address_type == GeneralNames::IP_ADDRESS_AND_NETMASK);
      // RFC 5280 section 4.2.1.10:
      // The syntax of iPAddress MUST be as described in Section 4.2.1.6 with
      // the following additions specifically for name constraints. For IPv4
      // addresses, the iPAddress field of GeneralName MUST contain eight (8)
      // octets, encoded in the style of RFC 4632 (CIDR) to represent an
      // address range [RFC4632]. For IPv6 addresses, the iPAddress field
      // MUST contain 32 octets similarly encoded. For example, a name
      // constraint for "class C" subnet 192.0.2.0 is represented as the
      // octets C0 00 02 00 FF FF FF 00, representing the CIDR notation
      // 192.0.2.0/24 (mask 255.255.255.0).
      if (value.size() != kIPv4AddressSize * 2 &&
          value.size() != kIPv6AddressSize * 2) {
        errors->AddError(kFailedParsingIp);
        return false;
      }
      der::Input addr = value.first(value.size() / 2);
      der::Input mask = value.subspan(value.size() / 2);
      if (!IsValidNetmask(mask)) {
        errors->AddError(kFailedParsingIp);
        return false;
      }
      subtrees->ip_address_ranges.emplace_back(addr, mask);
    }
  } else if (tag == (CBS_ASN1_CONTEXT_SPECIFIC | 8)) {
    // registeredID                    [8]     OBJECT IDENTIFIER }
    name_type = GENERAL_NAME_REGISTERED_ID;
    subtrees->registered_ids.push_back(value);
  } else {
    errors->AddError(kUnknownGeneralNameType,
                     CreateCertErrorParams1SizeT("tag", tag));
    return false;
  }
  BSSL_CHECK(GENERAL_NAME_NONE != name_type);
  subtrees->present_name_types |= name_type;
  return true;
}